

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getinfo.c
# Opt level: O2

CURLcode Curl_getinfo(Curl_easy *data,CURLINFO info,...)

{
  int iVar1;
  char *pcVar2;
  connectdata *pcVar3;
  curl_socket_t cVar4;
  curl_sslbackend cVar5;
  curl_slist *pcVar6;
  void *pvVar7;
  long lVar8;
  char *pcVar9;
  ssl_connect_data *psVar10;
  CURLcode CVar11;
  double dVar12;
  double dStack_100;
  va_list arg;
  double *local_c8;
  
  if (data == (Curl_easy *)0x0) {
    return CURLE_UNKNOWN_OPTION;
  }
  CVar11 = CURLE_UNKNOWN_OPTION;
  switch((info & 0xf00000) - 0x100000 >> 0x14) {
  case CURLINFO_NONE:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    switch(info) {
    case CURLINFO_FTP_ENTRY_PATH:
      pcVar9 = (data->state).most_recent_ftp_entrypath;
      break;
    case CURLINFO_REDIRECT_URL:
      pcVar9 = (data->info).wouldredirect;
      break;
    case CURLINFO_PRIMARY_IP:
      pcVar9 = (data->info).conn_primary_ip;
      break;
    case 0x100021:
    case 0x100022:
    case 0x100023:
    case 0x100025:
    case 0x100026:
    case 0x100027:
    case 0x100028:
      goto switchD_003f732c_default;
    case CURLINFO_RTSP_SESSION_ID:
      pcVar9 = (data->set).str[0x32];
      break;
    case CURLINFO_LOCAL_IP:
      pcVar9 = (data->info).conn_local_ip;
      break;
    default:
      if (info == CURLINFO_SCHEME) {
        pcVar9 = (data->info).conn_scheme;
      }
      else if (info == CURLINFO_CONTENT_TYPE) {
        pcVar9 = (data->info).contenttype;
      }
      else if (info == CURLINFO_PRIVATE) {
        pcVar9 = (char *)(data->set).private_data;
      }
      else {
        if (info != CURLINFO_EFFECTIVE_URL) {
          return CURLE_UNKNOWN_OPTION;
        }
        pcVar2 = (data->change).url;
        pcVar9 = "";
        if (pcVar2 != (char *)0x0) {
          pcVar9 = pcVar2;
        }
      }
    }
    *local_c8 = (double)pcVar9;
    goto LAB_003f7938;
  case 1:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    switch(info) {
    case CURLINFO_RESPONSE_CODE:
      dStack_100 = (double)(long)(data->info).httpcode;
      break;
    default:
      goto switchD_003f732c_default;
    case CURLINFO_HEADER_SIZE:
      dStack_100 = (double)(data->info).header_size;
      break;
    case CURLINFO_REQUEST_SIZE:
      dStack_100 = (double)(data->info).request_size;
      break;
    case CURLINFO_SSL_VERIFYRESULT:
      dStack_100 = (double)(data->set).ssl.certverifyresult;
      break;
    case CURLINFO_FILETIME:
      dStack_100 = (double)(data->info).filetime;
      break;
    case CURLINFO_REDIRECT_COUNT:
      dStack_100 = (double)(data->set).followlocation;
      break;
    case CURLINFO_HTTP_CONNECTCODE:
      dStack_100 = (double)(long)(data->info).httpproxycode;
      break;
    case CURLINFO_HTTPAUTH_AVAIL:
      dStack_100 = (double)(data->info).httpauthavail;
      break;
    case CURLINFO_PROXYAUTH_AVAIL:
      dStack_100 = (double)(data->info).proxyauthavail;
      break;
    case CURLINFO_OS_ERRNO:
      dStack_100 = (double)(long)(data->state).os_errno;
      break;
    case CURLINFO_NUM_CONNECTS:
      dStack_100 = (double)(data->info).numconnects;
      break;
    case CURLINFO_LASTSOCKET:
      cVar4 = Curl_getconnectinfo(data,(connectdata **)0x0);
      dStack_100 = (double)(long)cVar4;
      break;
    case CURLINFO_CONDITION_UNMET:
      dStack_100 = (double)(ulong)((byte)(data->info).field_0xe0 & 1);
      break;
    case CURLINFO_RTSP_CLIENT_CSEQ:
      dStack_100 = (double)(data->state).rtsp_next_client_CSeq;
      break;
    case CURLINFO_RTSP_SERVER_CSEQ:
      dStack_100 = (double)(data->state).rtsp_next_server_CSeq;
      break;
    case CURLINFO_RTSP_CSEQ_RECV:
      dStack_100 = (double)(data->state).rtsp_CSeq_recv;
      break;
    case CURLINFO_PRIMARY_PORT:
      dStack_100 = (double)(data->info).conn_primary_port;
      break;
    case CURLINFO_LOCAL_PORT:
      dStack_100 = (double)(data->info).conn_local_port;
      break;
    case CURLINFO_HTTP_VERSION:
      iVar1 = (data->info).httpversion;
      if (iVar1 == 10) {
        dStack_100 = 4.94065645841247e-324;
      }
      else if (iVar1 == 0x14) {
        dStack_100 = 1.48219693752374e-323;
      }
      else if (iVar1 == 0xb) {
        dStack_100 = 9.88131291682493e-324;
      }
      else {
        dStack_100 = 0.0;
      }
      break;
    case CURLINFO_PROXY_SSL_VERIFYRESULT:
      dStack_100 = (double)(data->set).proxy_ssl.certverifyresult;
      break;
    case CURLINFO_PROTOCOL:
      dStack_100 = (double)(ulong)(data->info).conn_protocol;
    }
    *local_c8 = dStack_100;
    goto LAB_003f7938;
  case 2:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    break;
  case 3:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    if (info == CURLINFO_TLS_SSL_PTR) {
LAB_003f762a:
      pcVar3 = data->conn;
      *local_c8 = (double)&data->tsi;
      cVar5 = Curl_ssl_backend();
      (data->tsi).backend = cVar5;
      (data->tsi).internals = (void *)0x0;
      if (cVar5 == CURLSSLBACKEND_NONE || pcVar3 == (connectdata *)0x0) {
        return CURLE_OK;
      }
      if ((pcVar3->ssl[0].field_0x10 & 1) == 0) {
        if ((pcVar3->ssl[1].field_0x10 & 1) == 0) {
          return CURLE_OK;
        }
        psVar10 = pcVar3->ssl + 1;
      }
      else {
        psVar10 = pcVar3->ssl;
      }
      pvVar7 = (*Curl_ssl->get_internals)(psVar10,info);
      (data->tsi).internals = pvVar7;
      return CURLE_OK;
    }
    if (info == CURLINFO_COOKIELIST) {
      pcVar6 = Curl_cookie_list(data);
    }
    else {
      if (info == CURLINFO_CERTINFO) {
        *local_c8 = (double)&(data->info).certs;
        goto LAB_003f7938;
      }
      if (info == CURLINFO_TLS_SESSION) goto LAB_003f762a;
      if (info != CURLINFO_SSL_ENGINES) {
        return CURLE_UNKNOWN_OPTION;
      }
      pcVar6 = Curl_ssl_engines_list(data);
    }
    *local_c8 = (double)pcVar6;
    goto LAB_003f7938;
  case 4:
    if (info != CURLINFO_ACTIVESOCKET) {
      return CURLE_UNKNOWN_OPTION;
    }
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    cVar4 = Curl_getconnectinfo(data,(connectdata **)0x0);
    *(curl_socket_t *)local_c8 = cVar4;
    return CURLE_OK;
  case 5:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    switch(info) {
    case CURLINFO_SIZE_UPLOAD_T:
      lVar8 = 0xf38;
      break;
    case CURLINFO_SIZE_DOWNLOAD_T:
      lVar8 = 0xf30;
      break;
    case CURLINFO_SPEED_DOWNLOAD_T:
      lVar8 = 0xf58;
      break;
    case CURLINFO_SPEED_UPLOAD_T:
      lVar8 = 0xf60;
      break;
    case 0x60000b:
    case 0x60000c:
    case 0x60000d:
      goto switchD_003f732c_default;
    case CURLINFO_FILETIME_T:
      lVar8 = 0x15e8;
      break;
    case CURLINFO_CONTENT_LENGTH_DOWNLOAD_T:
      lVar8 = 0xf20;
      if (((data->progress).flags & 0x40) != 0) break;
LAB_003f77e5:
      dVar12 = -NAN;
      goto LAB_003f7824;
    case CURLINFO_CONTENT_LENGTH_UPLOAD_T:
      lVar8 = 0xf28;
      if (((data->progress).flags & 0x20) == 0) goto LAB_003f77e5;
      break;
    default:
      switch(info) {
      case CURLINFO_TOTAL_TIME_T:
        lVar8 = 0xf50;
        break;
      case CURLINFO_NAMELOOKUP_TIME_T:
        lVar8 = 0xf68;
        break;
      case CURLINFO_CONNECT_TIME_T:
        lVar8 = 0xf70;
        break;
      case CURLINFO_PRETRANSFER_TIME_T:
        lVar8 = 0xf80;
        break;
      case CURLINFO_STARTTRANSFER_TIME_T:
        lVar8 = 0xf88;
        break;
      case CURLINFO_REDIRECT_TIME_T:
        lVar8 = 0xf90;
        break;
      case CURLINFO_APPCONNECT_TIME_T:
        lVar8 = 0xf78;
        break;
      default:
        goto switchD_003f732c_default;
      }
    }
    dVar12 = *(double *)((long)&data->next + lVar8);
LAB_003f7824:
    *local_c8 = dVar12;
    goto LAB_003f7938;
  default:
    goto switchD_003f732c_default;
  }
  switch(info) {
  case CURLINFO_TOTAL_TIME:
    dVar12 = (double)(data->progress).timespent;
    break;
  case CURLINFO_NAMELOOKUP_TIME:
    dVar12 = (double)(data->progress).t_nslookup;
    break;
  case CURLINFO_CONNECT_TIME:
    dVar12 = (double)(data->progress).t_connect;
    break;
  case CURLINFO_PRETRANSFER_TIME:
    dVar12 = (double)(data->progress).t_pretransfer;
    break;
  case CURLINFO_SIZE_UPLOAD:
    dVar12 = (double)(data->progress).uploaded;
    goto LAB_003f776f;
  case CURLINFO_SIZE_DOWNLOAD:
    dVar12 = (double)(data->progress).downloaded;
    goto LAB_003f776f;
  case CURLINFO_SPEED_DOWNLOAD:
    dVar12 = (double)(data->progress).dlspeed;
    goto LAB_003f776f;
  case CURLINFO_SPEED_UPLOAD:
    dVar12 = (double)(data->progress).ulspeed;
    goto LAB_003f776f;
  default:
    goto switchD_003f732c_default;
  case CURLINFO_CONTENT_LENGTH_DOWNLOAD:
    if (((data->progress).flags & 0x40) == 0) {
LAB_003f77af:
      dVar12 = -1.0;
    }
    else {
      dVar12 = (double)(data->progress).size_dl;
    }
    goto LAB_003f776f;
  case CURLINFO_CONTENT_LENGTH_UPLOAD:
    if (((data->progress).flags & 0x20) == 0) goto LAB_003f77af;
    dVar12 = (double)(data->progress).size_ul;
    goto LAB_003f776f;
  case CURLINFO_STARTTRANSFER_TIME:
    dVar12 = (double)(data->progress).t_starttransfer;
    break;
  case CURLINFO_REDIRECT_TIME:
    dVar12 = (double)(data->progress).t_redirect;
    break;
  case CURLINFO_APPCONNECT_TIME:
    dVar12 = (double)(data->progress).t_appconnect;
  }
  dVar12 = dVar12 / 1000000.0;
LAB_003f776f:
  *local_c8 = dVar12;
LAB_003f7938:
  CVar11 = CURLE_OK;
switchD_003f732c_default:
  return CVar11;
}

Assistant:

CURLcode Curl_getinfo(struct Curl_easy *data, CURLINFO info, ...)
{
  va_list arg;
  long *param_longp = NULL;
  double *param_doublep = NULL;
  curl_off_t *param_offt = NULL;
  const char **param_charp = NULL;
  struct curl_slist **param_slistp = NULL;
  curl_socket_t *param_socketp = NULL;
  int type;
  CURLcode result = CURLE_UNKNOWN_OPTION;

  if(!data)
    return result;

  va_start(arg, info);

  type = CURLINFO_TYPEMASK & (int)info;
  switch(type) {
  case CURLINFO_STRING:
    param_charp = va_arg(arg, const char **);
    if(param_charp)
      result = getinfo_char(data, info, param_charp);
    break;
  case CURLINFO_LONG:
    param_longp = va_arg(arg, long *);
    if(param_longp)
      result = getinfo_long(data, info, param_longp);
    break;
  case CURLINFO_DOUBLE:
    param_doublep = va_arg(arg, double *);
    if(param_doublep)
      result = getinfo_double(data, info, param_doublep);
    break;
  case CURLINFO_OFF_T:
    param_offt = va_arg(arg, curl_off_t *);
    if(param_offt)
      result = getinfo_offt(data, info, param_offt);
    break;
  case CURLINFO_SLIST:
    param_slistp = va_arg(arg, struct curl_slist **);
    if(param_slistp)
      result = getinfo_slist(data, info, param_slistp);
    break;
  case CURLINFO_SOCKET:
    param_socketp = va_arg(arg, curl_socket_t *);
    if(param_socketp)
      result = getinfo_socket(data, info, param_socketp);
    break;
  default:
    break;
  }

  va_end(arg);

  return result;
}